

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EulerAngles *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EulerAngles *local_18;
  EulerAngles *this_local;
  
  local_18 = this;
  this_local = (EulerAngles *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Psi: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Psi);
  poVar1 = std::operator<<(poVar1,",  Theta: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Theta);
  poVar1 = std::operator<<(poVar1,",  Phi: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Phi);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EulerAngles::GetAsString() const
{
    KStringStream ss;

    ss << "Psi: "       << m_f32Psi
       << ",  Theta: "  << m_f32Theta
       << ",  Phi: "    << m_f32Phi << "\n";

    return ss.str();
}